

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_key_derivation_key_agreement
          (psa_key_derivation_operation_t *operation,psa_key_derivation_step_t step,
          psa_key_handle_t private_key,uint8_t *peer_key,size_t peer_key_length)

{
  psa_status_t pVar1;
  size_t shared_secret_length;
  psa_key_slot_t *slot;
  uint8_t shared_secret [66];
  size_t local_88;
  psa_key_slot_t *local_80;
  uint8_t local_78 [80];
  
  pVar1 = -0x87;
  if ((operation->alg & 0x7f000000) == 0x30000000) {
    pVar1 = psa_get_key_from_slot(private_key,&local_80,0x1000,operation->alg);
    if (pVar1 == 0) {
      local_88 = 0;
      pVar1 = psa_key_agreement_raw_internal
                        (operation->alg & 0xfc0000 | 0x30000000,local_80,peer_key,peer_key_length,
                         local_78,0x42,&local_88);
      if (pVar1 == 0) {
        pVar1 = psa_key_derivation_input_internal(operation,step,0x1200,local_78,local_88);
      }
      mbedtls_platform_zeroize(local_78,local_88);
      if (pVar1 != 0) {
        psa_key_derivation_abort(operation);
      }
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_key_derivation_key_agreement( psa_key_derivation_operation_t *operation,
                                               psa_key_derivation_step_t step,
                                               psa_key_handle_t private_key,
                                               const uint8_t *peer_key,
                                               size_t peer_key_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;
    if( ! PSA_ALG_IS_KEY_AGREEMENT( operation->alg ) )
        return( PSA_ERROR_INVALID_ARGUMENT );
    status = psa_get_transparent_key( private_key, &slot,
                                      PSA_KEY_USAGE_DERIVE, operation->alg );
    if( status != PSA_SUCCESS )
        return( status );
    status = psa_key_agreement_internal( operation, step,
                                         slot,
                                         peer_key, peer_key_length );
    if( status != PSA_SUCCESS )
        psa_key_derivation_abort( operation );
    return( status );
}